

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::GetArgInstrsForCallAndApply
          (Inline *this,Instr *callInstr,Instr **implicitThisArgOut,Instr **explicitThisArgOut,
          Instr **argumentsOrArrayArgOut,uint *argOutCount)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  SymOpnd *pSVar4;
  StackSym *pSVar5;
  SymOpnd *pSVar6;
  RegOpnd *pRVar7;
  Inline *this_00;
  Instr *pIVar8;
  Instr *pIVar9;
  Instr *argInstr;
  undefined4 *local_38;
  
  pSVar4 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
  pSVar5 = IR::Opnd::GetStackSym(callInstr->m_src2);
  argInstr = (pSVar5->field_5).m_instrDef;
  pIVar9 = callInstr;
  if ((argInstr != (Instr *)0x0 & pSVar5->field_0x18) == 1) {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar3) {
LAB_00509ccb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_38 = 0;
    argInstr = (pSVar5->field_5).m_instrDef;
  }
  do {
    if ((argInstr->m_src2 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsSymOpnd(argInstr->m_src2), !bVar3)
       ) {
LAB_00509bdb:
      pIVar8 = (Instr *)0x0;
    }
    else {
      pSVar6 = IR::Opnd::AsSymOpnd(argInstr->m_src2);
      pSVar5 = Sym::AsStackSym(pSVar6->m_sym);
      bVar3 = StackSym::IsArgSlotSym(pSVar5);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar3) goto LAB_00509ccb;
        *local_38 = 0;
      }
      if (((((pSVar5->field_0x18 & 1) == 0) || ((pSVar5->field_5).m_instrDef == (Instr *)0x0)) &&
          (bVar3 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar3)) &&
         (bVar3 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar3) goto LAB_00509ccb;
        *local_38 = 0;
      }
      if ((pSVar5->field_0x18 & 1) == 0) goto LAB_00509bdb;
      pIVar8 = (pSVar5->field_5).m_instrDef;
    }
    if (argInstr->m_opcode != ArgOut_A_InlineSpecialized) {
      if (argInstr->m_opcode == StartCall) {
        if (pIVar8 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_38 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar3) goto LAB_00509ccb;
          *local_38 = 0;
        }
        break;
      }
      *argOutCount = *argOutCount + 1;
      *argumentsOrArrayArgOut = *explicitThisArgOut;
      *explicitThisArgOut = *implicitThisArgOut;
      *implicitThisArgOut = argInstr;
      pSVar6 = IR::Opnd::AsSymOpnd(&pSVar4->super_Opnd);
      pSVar5 = Sym::AsStackSym(pSVar6->m_sym);
      pSVar5->field_0x19 = pSVar5->field_0x19 | 0x40;
      pSVar4 = IR::Opnd::AsSymOpnd(&pSVar4->super_Opnd);
      this_00 = (Inline *)pSVar4->m_sym;
      pSVar5 = Sym::AsStackSym((Sym *)this_00);
      pSVar5->field_0x19 = pSVar5->field_0x19 | 0x10;
      ConvertToInlineBuiltInArgOut(this_00,argInstr);
      IR::Instr::Move(argInstr,pIVar9);
      pSVar4 = (SymOpnd *)argInstr->m_src2;
      pIVar9 = argInstr;
    }
    argInstr = pIVar8;
  } while (pIVar8 != (Instr *)0x0);
  pRVar7 = IR::Opnd::AsRegOpnd(&pSVar4->super_Opnd);
  puVar1 = &pRVar7->m_sym->field_0x18;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x4000;
  return;
}

Assistant:

void Inline::GetArgInstrsForCallAndApply(IR::Instr* callInstr, IR::Instr** implicitThisArgOut, IR::Instr** explicitThisArgOut, IR::Instr** argumentsOrArrayArgOut, uint &argOutCount)
{
    IR::Opnd * linkOpnd = callInstr->GetSrc2()->AsSymOpnd();
    IR::Instr * argInsertInstr = callInstr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        argOutCount++;

        *argumentsOrArrayArgOut = *explicitThisArgOut;
        *explicitThisArgOut = *implicitThisArgOut;
        *implicitThisArgOut = argInstr;

        linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_isInlinedArgSlot = true;
        linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_allocated = true;
        ConvertToInlineBuiltInArgOut(argInstr);

        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;

        linkOpnd = argInstr->GetSrc2();
        return false;
    });
    linkOpnd->AsRegOpnd()->m_sym->m_isInlinedArgSlot = true;
}